

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::RaceSuccessfulPromiseNode<void>::getNoError
          (RaceSuccessfulPromiseNode<void> *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> local_1a0;
  
  local_1a0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1a0.value.ptr.isSet = true;
  ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1a0);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1a0);
  return;
}

Assistant:

void getNoError(ExceptionOrValue &output) noexcept override {
    output.as<_::Void>() = _::Void();
  }